

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::moveAppend
          (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this,HistoryEntry *b,HistoryEntry *e
          )

{
  HistoryEntry *pHVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  HistoryEntry *pHVar6;
  int iVar7;
  qsizetype qVar8;
  
  if ((b != e) && (b < e)) {
    pHVar1 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).ptr;
    qVar8 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
    do {
      pHVar1[qVar8].url.d = (b->url).d;
      pDVar2 = (b->title).d.d;
      (b->url).d = (QUrlPrivate *)0x0;
      (b->title).d.d = (Data *)0x0;
      pHVar1[qVar8].title.d.d = pDVar2;
      pcVar3 = (b->title).d.ptr;
      (b->title).d.ptr = (char16_t *)0x0;
      pHVar1[qVar8].title.d.ptr = pcVar3;
      qVar4 = (b->title).d.size;
      (b->title).d.size = 0;
      pHVar1[qVar8].title.d.size = qVar4;
      iVar7 = b->vpos;
      uVar5 = *(undefined8 *)&b->focusIndicatorPosition;
      pHVar6 = pHVar1 + qVar8;
      pHVar6->hpos = b->hpos;
      pHVar6->vpos = iVar7;
      *(undefined8 *)(&pHVar6->hpos + 2) = uVar5;
      pHVar1[qVar8].type = b->type;
      b = b + 1;
      qVar8 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size + 1;
      (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size = qVar8;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }